

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreePrevious(BtCursor *pCur,int flags)

{
  char cVar1;
  ushort uVar2;
  uint uVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  MemPage *pMVar8;
  ulong uVar9;
  
  uVar9 = (ulong)(uint)flags;
  pCur->curFlags = pCur->curFlags & 0xf1;
  (pCur->info).nSize = 0;
  if (((pCur->eState == '\x01') && (pCur->ix != 0)) && (pCur->apPage[pCur->iPage]->leaf != '\0')) {
    pCur->ix = pCur->ix - 1;
    return 0;
  }
  bVar4 = pCur->eState;
  if (bVar4 != 1) {
    if (2 < bVar4) {
      iVar6 = btreeRestoreCursorPosition(pCur);
      if (iVar6 != 0) {
        return iVar6;
      }
      bVar4 = pCur->eState;
    }
    if (bVar4 == 0) {
      return 0x65;
    }
    iVar6 = pCur->skipNext;
    if (iVar6 != 0) {
      pCur->eState = '\x01';
      pCur->skipNext = 0;
      if (iVar6 < 0) {
        return 0;
      }
    }
  }
  iVar6 = (int)uVar9;
  pMVar8 = pCur->apPage[pCur->iPage];
  uVar2 = pCur->ix;
  if (pMVar8->leaf == '\0') {
    uVar3 = *(uint *)(pMVar8->aData +
                     (CONCAT11(pMVar8->aCellIdx[(ulong)uVar2 * 2],
                               pMVar8->aCellIdx[(ulong)uVar2 * 2 + 1]) & pMVar8->maskPage));
    iVar5 = moveToChild(pCur,uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                             uVar3 << 0x18);
    if (iVar5 == 0) {
      iVar6 = moveToRightmost(pCur);
      return iVar6;
    }
  }
  else {
    if (uVar2 == 0) {
      do {
        cVar1 = pCur->iPage;
        lVar7 = (long)cVar1;
        if (lVar7 == 0) {
          pCur->eState = '\0';
          return 0x65;
        }
        (pCur->info).nSize = 0;
        pCur->curFlags = pCur->curFlags & 0xf9;
        pCur->ix = pCur->aiIdx[lVar7 + -1];
        pCur->iPage = cVar1 + -1;
        sqlite3PagerUnrefNotNull(pCur->apPage[lVar7]->pDbPage);
        iVar6 = (int)uVar9;
        uVar2 = pCur->ix;
      } while (uVar2 == 0);
      pMVar8 = pCur->apPage[pCur->iPage];
    }
    pCur->ix = uVar2 - 1;
    iVar5 = 0;
    if ((pMVar8->intKey != '\0') && (pMVar8->leaf == '\0')) {
      iVar6 = sqlite3BtreePrevious(pCur,iVar6);
      return iVar6;
    }
  }
  return iVar5;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreePrevious(BtCursor *pCur, int flags){
  assert( cursorOwnsBtShared(pCur) );
  assert( flags==0 || flags==1 );
  assert( pCur->skipNext==0 || pCur->eState!=CURSOR_VALID );
  UNUSED_PARAMETER( flags );  /* Used in COMDB2 but not native SQLite */
  pCur->curFlags &= ~(BTCF_AtLast|BTCF_ValidOvfl|BTCF_ValidNKey);
  pCur->info.nSize = 0;
  if( pCur->eState!=CURSOR_VALID
   || pCur->ix==0
   || pCur->apPage[pCur->iPage]->leaf==0
  ){
    return btreePrevious(pCur);
  }
  pCur->ix--;
  return SQLITE_OK;
}